

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_MissileAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  PClassActor *MissileType;
  undefined4 extraout_var_01;
  AActor *self;
  char *__assertion;
  bool bVar4;
  undefined8 local_18;
  PClass *pPVar2;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003c8b7d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        pPVar2 = (self->super_DThinker).super_DObject.Class;
        if (pPVar2 == (PClass *)0x0) {
          iVar1 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
          (self->super_DThinker).super_DObject.Class = pPVar2;
        }
        bVar4 = pPVar2 != (PClass *)0x0;
        if (pPVar2 != pPVar3 && bVar4) {
          do {
            pPVar2 = pPVar2->ParentClass;
            bVar4 = pPVar2 != (PClass *)0x0;
            if (pPVar2 == pPVar3) break;
          } while (pPVar2 != (PClass *)0x0);
        }
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c8b7d;
        }
        goto LAB_003c8af6;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_003c8b6d;
    self = (AActor *)0x0;
LAB_003c8af6:
    pPVar3 = (self->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar1);
      (self->super_DThinker).super_DObject.Class = pPVar3;
    }
    local_18._4_4_ = *(uint *)((long)&pPVar3[1].ParentClass + 4);
    pPVar3 = PClass::FindClass((FName *)((long)&local_18 + 4));
    MissileType = dyn_cast<PClassActor>((DObject *)pPVar3);
    local_18 = (ulong)local_18._4_4_ << 0x20;
    pPVar3 = (self->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar3 = (PClass *)CONCAT44(extraout_var_01,iVar1);
      (self->super_DThinker).super_DObject.Class = pPVar3;
    }
    DoAttack(self,false,true,0,(FSoundID *)&local_18,MissileType,(double)pPVar3[1].Pointers);
    return 0;
  }
LAB_003c8b6d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003c8b7d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3cb,
                "int AF_AActor_A_MissileAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MissileAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PClassActor *MissileType = PClass::FindActor(self->GetClass()->MissileName);
	DoAttack(self, false, true, 0, 0, MissileType, self->GetClass()->MissileHeight);
	return 0;
}